

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O3

bool __thiscall
CustomServer::on_client_connect
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined8 local_38;
  void *pvStack_30;
  undefined8 local_28;
  long lStack_20;
  
  bVar1 = is_banned(this,client);
  if (!bVar1) {
    local_28 = 0;
    lStack_20 = 0;
    local_38 = 0;
    pvStack_30 = (void *)0x0;
    blcl::net::connection<MsgType>::send
              ((client->
               super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)&local_38,__buf,in_RCX,in_R8D);
    if (pvStack_30 != (void *)0x0) {
      operator_delete(pvStack_30,lStack_20 - (long)pvStack_30);
    }
  }
  return !bVar1;
}

Assistant:

bool on_client_connect(std::shared_ptr<blcl::net::connection<MsgType>> client) override {
        if (is_banned(client)) {
            return false;
        }

        blcl::net::message<MsgType> msg;
        msg.header.id = MsgType::ServerAccept;
        client->send(msg);

        return true;
    }